

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

void init_opt_struct(void)

{
  anon_union_16_4_d826100f_for_nh_option_desc_4 aVar1;
  anon_union_16_4_d826100f_for_nh_option_desc_4 aVar2;
  nh_option_desc *pnVar3;
  nh_option_desc *pnVar4;
  nh_option_desc *pnVar5;
  char **ppcVar6;
  nh_listitem *pnVar7;
  Race *pRVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  
  options = clone_optlist(const_options);
  pnVar3 = clone_optlist(const_birth_options);
  role_spec.numchoices = 2;
  for (ppcVar6 = &roles[0].name.f;
      (((RoleName *)(ppcVar6 + -1))->m != (char *)0x0 || (*ppcVar6 != (char *)0x0));
      ppcVar6 = ppcVar6 + 0x23) {
    role_spec.numchoices = role_spec.numchoices + 1;
  }
  birth_options = pnVar3;
  role_spec.choices = (nh_listitem *)malloc((ulong)(uint)role_spec.numchoices << 4);
  iVar11 = 0;
  pnVar7 = role_spec.choices;
  for (ppcVar6 = &roles[0].name.f;
      (pcVar12 = ((RoleName *)(ppcVar6 + -1))->m, pcVar12 != (char *)0x0 ||
      (pcVar12 = *ppcVar6, pcVar12 != (char *)0x0)); ppcVar6 = ppcVar6 + 0x23) {
    pnVar7->id = iVar11;
    pnVar7->caption = pcVar12;
    pnVar7 = pnVar7 + 1;
    iVar11 = iVar11 + 1;
  }
  pnVar7->id = -1;
  pnVar7->caption = "ask";
  pnVar7[1].id = -2;
  pnVar7[1].caption = "random";
  race_spec.numchoices = 1;
  pRVar8 = races;
  do {
    race_spec.numchoices = race_spec.numchoices + 1;
    ppcVar6 = &pRVar8->noun;
    pRVar8 = pRVar8 + 1;
  } while (*ppcVar6 != (char *)0x0);
  race_spec.choices = (nh_listitem *)malloc((ulong)(uint)race_spec.numchoices << 4);
  pcVar12 = "human";
  pRVar8 = races;
  ppcVar6 = &(race_spec.choices)->caption;
  lVar10 = 0;
  do {
    lVar9 = lVar10;
    pRVar8 = pRVar8 + 1;
    ((nh_listitem *)(ppcVar6 + -1))->id = (int)lVar9;
    *ppcVar6 = pcVar12;
    lVar10 = lVar9 + 1;
    pcVar12 = pRVar8->noun;
    ppcVar6 = ppcVar6 + 2;
  } while (pcVar12 != (char *)0x0);
  race_spec.choices[lVar10].id = -1;
  race_spec.choices[lVar10].caption = "ask";
  race_spec.choices[lVar9 + 2].id = -2;
  race_spec.choices[lVar9 + 2].caption = "random";
  pnVar5 = options;
  pnVar4 = find_option(options,"disclose");
  (pnVar4->field_4).e = disclose_spec;
  pnVar4 = find_option(pnVar5,"fruit");
  (pnVar4->field_4).i.max = 0x20;
  pnVar4 = find_option(pnVar5,"hp_notify_format");
  (pnVar4->field_4).i.max = 0x50;
  pnVar4 = find_option(pnVar5,"menumatch");
  (pnVar4->field_4).e = menumatch_spec;
  pnVar4 = find_option(pnVar5,"menustyle");
  (pnVar4->field_4).e = menustyle_spec;
  pnVar4 = find_option(pnVar5,"pickup_burden");
  (pnVar4->field_4).e = pickup_burden_spec;
  pnVar4 = find_option(pnVar5,"packorder");
  (pnVar4->field_4).i.max = 0x12;
  pnVar4 = find_option(pnVar5,"pilesize");
  (pnVar4->field_4).i.min = 1;
  pnVar4 = find_option(pnVar5,"pilesize");
  (pnVar4->field_4).i.max = 0x14;
  pnVar4 = find_option(pnVar5,"runmode");
  (pnVar4->field_4).e = runmode_spec;
  pnVar4 = find_option(pnVar5,"safe_peaceful");
  (pnVar4->field_4).e = safe_peaceful_spec;
  pnVar4 = find_option(pnVar5,"sparkle");
  (pnVar4->field_4).i.min = 0;
  pnVar4 = find_option(pnVar5,"sparkle");
  (pnVar4->field_4).i.max = 0x15;
  pnVar4 = find_option(pnVar5,"spellorder");
  (pnVar4->field_4).i.max = 0x4e;
  pnVar5 = find_option(pnVar5,"autopickup_rules");
  (pnVar5->field_4).a = autopickup_spec;
  pnVar5 = find_option(pnVar3,"align");
  (pnVar5->field_4).e = align_spec;
  pnVar5 = find_option(pnVar3,"gender");
  (pnVar5->field_4).e = gender_spec;
  pnVar5 = find_option(pnVar3,"role");
  aVar1.e.numchoices = role_spec.numchoices;
  aVar1.e.choices = role_spec.choices;
  aVar1._12_4_ = role_spec._12_4_;
  pnVar5->field_4 = aVar1;
  pnVar5 = find_option(pnVar3,"race");
  aVar2.e.numchoices = race_spec.numchoices;
  aVar2.e.choices = race_spec.choices;
  aVar2._12_4_ = race_spec._12_4_;
  pnVar5->field_4 = aVar2;
  pnVar5 = find_option(pnVar3,"pettype");
  (pnVar5->field_4).e = pettype_spec;
  pnVar5 = find_option(pnVar3,"catname");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar5 = find_option(pnVar3,"dogname");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar5 = find_option(pnVar3,"horsename");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar5 = find_option(pnVar3,"crocname");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar5 = find_option(pnVar3,"monkeyname");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar5 = find_option(pnVar3,"wolfname");
  (pnVar5->field_4).i.max = 0x3f;
  pnVar3 = find_option(pnVar3,"ratname");
  (pnVar3->field_4).i.max = 0x3f;
  flags.init_role = -1;
  flags.init_race = -1;
  flags.init_gend = -1;
  flags.init_align = -1;
  return;
}

Assistant:

void init_opt_struct(void)
{
	options = clone_optlist(const_options);
	birth_options = clone_optlist(const_birth_options);
	
	build_role_spec();
	build_race_spec();
	
	/* initialize option definitions */
	find_option(options, "disclose")->e = disclose_spec;
	find_option(options, "fruit")->s.maxlen = PL_FSIZ;
	find_option(options, "hp_notify_format")->s.maxlen = 80; /* min term width */
	find_option(options, "menumatch")->e = menumatch_spec;
	find_option(options, "menustyle")->e = menustyle_spec;
	find_option(options, "pickup_burden")->e = pickup_burden_spec;
	find_option(options, "packorder")->s.maxlen = MAXOCLASSES;
	find_option(options, "pilesize")->i.min = 1;
	find_option(options, "pilesize")->i.max = 20;
	find_option(options, "runmode")->e = runmode_spec;
	find_option(options, "safe_peaceful")->e = safe_peaceful_spec;
	find_option(options, "sparkle")->i.min = 0;
	find_option(options, "sparkle")->i.max = 21; /* SHIELD_COUNT in display.h */
	find_option(options, "spellorder")->s.maxlen = 78; /* "a-bc-d...Y-Z" */
	find_option(options, "autopickup_rules")->a = autopickup_spec;
	
	find_option(birth_options, "align")->e = align_spec;
	find_option(birth_options, "gender")->e = gender_spec;
	find_option(birth_options, "role")->e = role_spec;
	find_option(birth_options, "race")->e = race_spec;
	find_option(birth_options, "pettype")->e = pettype_spec;
	find_option(birth_options, "catname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "dogname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "horsename")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "crocname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "monkeyname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "wolfname")->s.maxlen = PL_PSIZ;
	find_option(birth_options, "ratname")->s.maxlen = PL_PSIZ;

	/* If no config file exists, these values will not get set until they
	 * have already been used during game startup.  (-1) is a much better
	 * default, as 0 will always cause a lawful male Archologist to be created */
	flags.init_align = flags.init_gend = flags.init_race = flags.init_role = -1;
}